

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initLexYaccFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *pQVar1;
  ProStringList *pPVar2;
  long in_FS_OFFSET;
  ProKey PStack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).LexYaccFiles;
  QString::operator=(&this_00->Name,"Lex / Yacc Files");
  (this->vcProject).LexYaccFiles.ParseFiles = _False;
  QString::operator=(&(this->vcProject).LexYaccFiles.Filter,"l;y");
  QString::operator=(&(this->vcProject).LexYaccFiles.Guid,"{E12AE0D2-192F-4d59-BD23-7D3FA58D3183}");
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&PStack_58,"LEXSOURCES");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&PStack_58);
  VCFilter::addFiles(this_00,pPVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_58);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&PStack_58,"YACCSOURCES");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&PStack_58);
  VCFilter::addFiles(this_00,pPVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_58);
  (this->vcProject).LexYaccFiles.Project = this;
  (this->vcProject).LexYaccFiles.Config = &(this->vcProject).Configuration;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLexYaccFiles()
{
    vcProject.LexYaccFiles.Name = "Lex / Yacc Files";
    vcProject.LexYaccFiles.ParseFiles = _False;
    vcProject.LexYaccFiles.Filter = "l;y";
    vcProject.LexYaccFiles.Guid = _GUIDLexYaccFiles;

    vcProject.LexYaccFiles.addFiles(project->values("LEXSOURCES"));
    vcProject.LexYaccFiles.addFiles(project->values("YACCSOURCES"));

    vcProject.LexYaccFiles.Project = this;
    vcProject.LexYaccFiles.Config = &(vcProject.Configuration);
}